

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *field)

{
  size_t *psVar1;
  ExportModuleField *pEVar2;
  ModuleField *pMVar3;
  ModuleFieldList *pMVar4;
  Export *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  pEVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  local_58 = (Export *)
             (((Location *)
              ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField +
              0x18))->filename)._M_len;
  uStack_50 = *(undefined4 *)
               ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField
               + 0x20);
  uStack_4c = *(undefined4 *)
               ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField
               + 0x24);
  local_48 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
              ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField +
              0x28))->field_0).line;
  uStack_44 = *(undefined4 *)
               ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField
               + 0x2c);
  uStack_40 = *(undefined4 *)
               ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField
               + 0x30);
  uStack_3c = *(undefined4 *)
               ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField
               + 0x34);
  local_38 = (undefined4)
             ((ulong)((long)(this->exports).
                            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->exports).
                           super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::__cxx11::string&,wabt::Binding>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->export_bindings,0,&pEVar2->export_,&local_58);
  local_58 = &pEVar2->export_;
  std::vector<wabt::Export*,std::allocator<wabt::Export*>>::emplace_back<wabt::Export*>
            ((vector<wabt::Export*,std::allocator<wabt::Export*>> *)&this->exports,&local_58);
  pEVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl = (ExportModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar3 = (this->fields).last_;
    if (pMVar3 == (ModuleField *)0x0) {
      pMVar4 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField + 0x10)
           = pMVar3;
      pMVar4 = (ModuleFieldList *)&pMVar3->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar4->first_ = (ModuleField *)pEVar2;
    (this->fields).last_ = (ModuleField *)pEVar2;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<ExportModuleField> field) {
  // Exported names are allowed to be empty.
  Export& export_ = field->export_;
  export_bindings.emplace(export_.name, Binding(field->loc, exports.size()));
  exports.push_back(&export_);
  fields.push_back(std::move(field));
}